

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cpp
# Opt level: O0

void print_socket_error(void)

{
  int *piVar1;
  char *pcVar2;
  ostream *this;
  
  piVar1 = __errno_location();
  pcVar2 = strerror(*piVar1);
  this = std::operator<<((ostream *)&std::cout,pcVar2);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_socket_error()
{
	using namespace std;

#ifdef _WIN32
	LPSTR msg = nullptr;
	FormatMessage(FORMAT_MESSAGE_ALLOCATE_BUFFER | FORMAT_MESSAGE_FROM_SYSTEM,
	              0, WSAGetLastError(), 0, (LPSTR)&msg, 0, 0);
	cout << msg << endl;
	LocalFree(msg);
#else
	cout << strerror(errno) << endl;
#endif
}